

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Token * new_token(Lexer *lexer,int kind,char *s)

{
  uint uVar1;
  void *any;
  Token *pTVar2;
  size_t sVar3;
  
  any = malloc(0x18);
  pTVar2 = (Token *)require_not_null(any,"Failed to allocate space");
  uVar1 = lexer->col_pos;
  sVar3 = strlen(s);
  pTVar2->col_pos = ~(uint)sVar3 + uVar1;
  pTVar2->row_pos = lexer->row_pos;
  pTVar2->kind = kind;
  pTVar2->text = s;
  return pTVar2;
}

Assistant:

Token *new_token(Lexer *lexer, int kind, char *s) {
    Token *token = new(Token);
    token->col_pos = lexer->col_pos - 1 - strlen(s);
    token->row_pos = lexer->row_pos;
    token->kind = kind;
    token->text = s;
    return token;
}